

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallExportGenerator::GenerateScriptConfigs
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  bool bVar1;
  cmScriptGeneratorIndent cVar2;
  pointer pcVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar4;
  ulong uVar5;
  ostream *poVar6;
  char *pcVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_00;
  undefined1 local_430 [8];
  string config_test_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *i_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1_3;
  undefined1 local_3e0 [8];
  string config_test_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_2;
  string local_370;
  int local_34c;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  cmScriptGeneratorIndent local_338;
  cmScriptGeneratorIndent local_334;
  Indent indentNNN;
  Indent indentNN;
  Indent indentN;
  string local_2f8;
  cmAlphaNum local_2d8;
  undefined1 local_2a8 [8];
  string toInstallFile;
  cmAlphaNum local_258;
  undefined1 local_228 [8];
  string installedFile;
  string local_200;
  cmAlphaNum local_1e0;
  cmAlphaNum local_1b0;
  undefined1 local_180 [8];
  string installedDir;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  string config_file_example;
  cmAlphaNum local_f0;
  undefined1 local_c0 [8];
  string cxx_module_dest;
  undefined1 local_90 [8];
  string config_test;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostream *os_local;
  cmInstallExportGenerator *this_local;
  Indent indent_local;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = indent.Level;
  this_local._4_4_ = indent.Level;
  cmScriptGenerator::GenerateScriptConfigs((cmScriptGenerator *)this,os,indent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pcVar3 = std::
           unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ::operator->(&this->EFGen);
  pmVar4 = cmExportInstallFileGenerator::GetConfigImportFiles_abi_cxx11_(pcVar3);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(pmVar4);
  i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(pmVar4);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
    config_test.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,&((reference)config_test.field_2._8_8_)->second);
    cmScriptGenerator::CreateConfigTest
              ((string *)local_90,(cmScriptGenerator *)this,(string *)config_test.field_2._8_8_);
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar6 = std::operator<<(poVar6,"if(");
    poVar6 = std::operator<<(poVar6,(string *)local_90);
    std::operator<<(poVar6,")\n");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cVar2 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&(this->super_cmInstallGenerator).Destination,
               cmInstallType_FILES,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,false,pcVar7,(char *)0x0,(char *)0x0,(char *)0x0,(Indent)cVar2.Level,
               (char *)0x0);
    cxx_module_dest.field_2._12_4_ = this_local._4_4_;
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    std::operator<<(poVar6,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
    std::__cxx11::string::~string((string *)local_90);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  cmAlphaNum::cmAlphaNum(&local_f0,&(this->super_cmInstallGenerator).Destination);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&config_file_example.field_2 + 8),'/');
  cmStrCat<std::__cxx11::string>
            ((string *)local_c0,&local_f0,(cmAlphaNum *)((long)&config_file_example.field_2 + 8),
             &this->CxxModulesDirectory);
  std::__cxx11::string::string((string *)&__range1_1);
  pcVar3 = std::
           unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ::operator->(&this->EFGen);
  pmVar4 = cmExportInstallFileGenerator::GetConfigCxxModuleFiles_abi_cxx11_(pcVar3);
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pmVar4);
  i_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(pmVar4);
  bVar1 = std::operator!=(&__end1_1,(_Self *)&i_1);
  if (bVar1) {
    installedDir.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator*(&__end1_1);
    std::__cxx11::string::operator=
              ((string *)&__range1_1,(string *)&((reference)installedDir.field_2._8_8_)->second);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_1b0,"$ENV{DESTDIR}");
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_200,(string *)local_c0);
    cmAlphaNum::cmAlphaNum(&local_1e0,&local_200);
    installedFile.field_2._M_local_buf[0xf] = '/';
    cmStrCat<char>((string *)local_180,&local_1b0,&local_1e0,
                   installedFile.field_2._M_local_buf + 0xf);
    std::__cxx11::string::~string((string *)&local_200);
    cmAlphaNum::cmAlphaNum(&local_258,(string *)local_180);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&toInstallFile.field_2 + 8),"/cxx-modules.cmake");
    cmStrCat<>((string *)local_228,&local_258,(cmAlphaNum *)((long)&toInstallFile.field_2 + 8));
    cmsys::SystemTools::GetFilenamePath(&local_2f8,(string *)&__range1_1);
    cmAlphaNum::cmAlphaNum(&local_2d8,&local_2f8);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&indentN,"/cxx-modules.cmake");
    cmStrCat<>((string *)local_2a8,&local_2d8,(cmAlphaNum *)&indentN);
    std::__cxx11::string::~string((string *)&local_2f8);
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar6 = std::operator<<(poVar6,"if(EXISTS \"");
    poVar6 = std::operator<<(poVar6,(string *)local_228);
    std::operator<<(poVar6,"\")\n");
    indentNNN.Level =
         (int)cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    local_334 = cmScriptGeneratorIndent::Next(&indentNNN,2);
    local_338 = cmScriptGeneratorIndent::Next(&local_334,2);
    local_33c = indentNNN.Level;
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indentNNN.Level);
    poVar6 = std::operator<<(poVar6,"file(DIFFERENT _cmake_export_file_changed FILES\n");
    local_340 = indentNNN.Level;
    poVar6 = ::operator<<(poVar6,(cmScriptGeneratorIndent)indentNNN.Level);
    poVar6 = std::operator<<(poVar6,"     \"");
    poVar6 = std::operator<<(poVar6,(string *)local_228);
    poVar6 = std::operator<<(poVar6,"\"\n");
    local_344 = indentNNN.Level;
    poVar6 = ::operator<<(poVar6,(cmScriptGeneratorIndent)indentNNN.Level);
    poVar6 = std::operator<<(poVar6,"     \"");
    poVar6 = std::operator<<(poVar6,(string *)local_2a8);
    std::operator<<(poVar6,"\")\n");
    local_348 = indentNNN.Level;
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indentNNN.Level);
    std::operator<<(poVar6,"if(_cmake_export_file_changed)\n");
    local_34c = local_334.Level;
    poVar6 = ::operator<<(os,local_334);
    poVar6 = std::operator<<(poVar6,"file(GLOB _cmake_old_config_files \"");
    poVar6 = std::operator<<(poVar6,(string *)local_180);
    pcVar3 = std::
             unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ::operator->(&this->EFGen);
    cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_(&local_370,pcVar3);
    poVar6 = std::operator<<(poVar6,(string *)&local_370);
    std::operator<<(poVar6,"\")\n");
    std::__cxx11::string::~string((string *)&local_370);
    poVar6 = ::operator<<(os,local_334);
    std::operator<<(poVar6,"if(_cmake_old_config_files)\n");
    poVar6 = ::operator<<(os,local_338);
    std::operator<<(poVar6,
                    "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
                   );
    poVar6 = ::operator<<(os,local_338);
    poVar6 = std::operator<<(poVar6,"message(STATUS \"Old C++ module export file \\\"");
    poVar6 = std::operator<<(poVar6,(string *)local_228);
    std::operator<<(poVar6,
                    "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n"
                   );
    poVar6 = ::operator<<(os,local_338);
    std::operator<<(poVar6,"unset(_cmake_old_config_files_text)\n");
    poVar6 = ::operator<<(os,local_338);
    std::operator<<(poVar6,"file(REMOVE ${_cmake_old_config_files})\n");
    poVar6 = ::operator<<(os,local_334);
    std::operator<<(poVar6,"endif()\n");
    poVar6 = ::operator<<(os,local_334);
    std::operator<<(poVar6,"unset(_cmake_old_config_files)\n");
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indentNNN.Level);
    std::operator<<(poVar6,"endif()\n");
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indentNNN.Level);
    std::operator<<(poVar6,"unset(_cmake_export_file_changed)\n");
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    std::operator<<(poVar6,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(value_type *)local_2a8);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)local_c0,cmInstallType_FILES,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,false,pcVar7,(char *)0x0,(char *)0x0,(char *)0x0,this_local._4_4_,
               (char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_228);
    std::__cxx11::string::~string((string *)local_180);
  }
  pcVar3 = std::
           unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ::operator->(&this->EFGen);
  pmVar4 = cmExportInstallFileGenerator::GetConfigCxxModuleFiles_abi_cxx11_(pcVar3);
  __end1_2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pmVar4);
  i_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(pmVar4);
  while (bVar1 = std::operator!=(&__end1_2,(_Self *)&i_2), bVar1) {
    config_test_1.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator*(&__end1_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,&((reference)config_test_1.field_2._8_8_)->second);
    cmScriptGenerator::CreateConfigTest
              ((string *)local_3e0,(cmScriptGenerator *)this,(string *)config_test_1.field_2._8_8_);
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar6 = std::operator<<(poVar6,"if(");
    poVar6 = std::operator<<(poVar6,(string *)local_3e0);
    std::operator<<(poVar6,")\n");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cVar2 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)local_c0,cmInstallType_FILES,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,false,pcVar7,(char *)0x0,(char *)0x0,(char *)0x0,(Indent)cVar2.Level,
               (char *)0x0);
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    std::operator<<(poVar6,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
    std::__cxx11::string::~string((string *)local_3e0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_2);
  }
  pcVar3 = std::
           unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ::operator->(&this->EFGen);
  this_00 = cmExportInstallFileGenerator::GetConfigCxxModuleTargetFiles_abi_cxx11_(pcVar3);
  __end1_3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin(this_00);
  i_3 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end(this_00);
  while (bVar1 = std::operator!=(&__end1_3,(_Self *)&i_3), bVar1) {
    config_test_2.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*(&__end1_3);
    cmScriptGenerator::CreateConfigTest
              ((string *)local_430,(cmScriptGenerator *)this,(string *)config_test_2.field_2._8_8_);
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar6 = std::operator<<(poVar6,"if(");
    poVar6 = std::operator<<(poVar6,(string *)local_430);
    std::operator<<(poVar6,")\n");
    files_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(config_test_2.field_2._8_8_ + 0x20);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cVar2 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)local_c0,cmInstallType_FILES,files_00,
               false,pcVar7,(char *)0x0,(char *)0x0,(char *)0x0,(Indent)cVar2.Level,(char *)0x0);
    poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    std::operator<<(poVar6,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
    std::__cxx11::string::~string((string *)local_430);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1_3);
  }
  std::__cxx11::string::~string((string *)&__range1_1);
  std::__cxx11::string::~string((string *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptConfigs(std::ostream& os,
                                                     Indent indent)
{
  // Create the main install rules first.
  this->cmInstallGenerator::GenerateScriptConfigs(os, indent);

  // Now create a configuration-specific install rule for the import
  // file of each configuration.
  std::vector<std::string> files;
  for (auto const& i : this->EFGen->GetConfigImportFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }

  // Now create a configuration-specific install rule for the C++ module import
  // property file of each configuration.
  auto cxx_module_dest =
    cmStrCat(this->Destination, '/', this->CxxModulesDirectory);
  std::string config_file_example;
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    config_file_example = i.second;
    break;
  }
  if (!config_file_example.empty()) {
    // Remove old per-configuration export files if the main changes.
    std::string installedDir = cmStrCat(
      "$ENV{DESTDIR}", ConvertToAbsoluteDestination(cxx_module_dest), '/');
    std::string installedFile = cmStrCat(installedDir, "/cxx-modules.cmake");
    std::string toInstallFile =
      cmStrCat(cmSystemTools::GetFilenamePath(config_file_example),
               "/cxx-modules.cmake");
    os << indent << "if(EXISTS \"" << installedFile << "\")\n";
    Indent indentN = indent.Next();
    Indent indentNN = indentN.Next();
    Indent indentNNN = indentNN.Next();
    /* clang-format off */
    os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
       << indentN << "     \"" << installedFile << "\"\n"
       << indentN << "     \"" << toInstallFile << "\")\n";
    os << indentN << "if(_cmake_export_file_changed)\n";
    os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
       << this->EFGen->GetConfigImportFileGlob() << "\")\n";
    os << indentNN << "if(_cmake_old_config_files)\n";
    os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
    os << indentNNN << R"(message(STATUS "Old C++ module export file \")" << installedFile
       << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
    os << indentNNN << "unset(_cmake_old_config_files_text)\n";
    os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
    os << indentNN << "endif()\n";
    os << indentNN << "unset(_cmake_old_config_files)\n";
    os << indentN << "endif()\n";
    os << indentN << "unset(_cmake_export_file_changed)\n";
    os << indent << "endif()\n";
    /* clang-format on */

    // All of these files are siblings; get its location to know where the
    // "anchor" file is.
    files.push_back(toInstallFile);
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent);
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleTargetFiles()) {
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, i.second,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
}